

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O2

size_t __thiscall
trieste::PassDef::apply_special<false,true,true>(PassDef *this,Node *root,Match *match)

{
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *node;
  element_type *peVar1;
  long lVar2;
  undefined8 *puVar3;
  char cVar4;
  bool bVar5;
  iterator iVar6;
  unsigned_long uVar7;
  ptrdiff_t pVar8;
  element_type *peVar9;
  undefined8 *puVar10;
  _Base_ptr p_Var11;
  Node *curr;
  iterator it;
  iterator start;
  vector<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>
  path;
  Node root_1;
  NodeIt local_b0;
  unsigned_long local_a8;
  unsigned_long local_a0;
  PassDef *local_98;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_90;
  NodeIt local_80;
  _Vector_base<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>
  local_78;
  map<trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>_>_>_>
  *local_60;
  element_type *local_58;
  _Base_ptr local_48;
  _Base_ptr local_40;
  map<trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>_>_>_>
  *local_38;
  
  std::__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<trieste::NodeDef,void>
            ((__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffa8,
             (__weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
             (root->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  if ((((local_58->type_).def)->fl & 0x40) == 0) {
    local_38 = &this->pre_;
    iVar6 = CLI::std::
            _Rb_tree<trieste::Token,_std::pair<const_trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>_>,_std::_Select1st<std::pair<const_trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>_>_>_>
            ::find(&local_38->_M_t,&local_58->type_);
    local_40 = &(this->pre_)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_98 = this;
    if (iVar6._M_node == local_40) {
      local_a0 = 0;
    }
    else {
      CLI::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)&local_78,
                 (__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
                 &stack0xffffffffffffffa8);
      local_a0 = CLI::std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>::operator()
                           ((function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)> *)
                            &iVar6._M_node[1]._M_parent,(shared_ptr<trieste::NodeDef> *)&local_78);
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_78._M_impl.super__Vector_impl_data._M_finish);
    }
    local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_90._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (local_58->children).
         super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_90._M_ptr = (element_type *)&stack0xffffffffffffffa8;
    std::
    vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
    ::
    emplace_back<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>
              ((vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
                *)&local_78,
               (pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
                *)&local_90);
    local_60 = &local_98->post_;
    p_Var11 = &(local_98->post_)._M_t._M_impl.super__Rb_tree_header._M_header;
    while (local_78._M_impl.super__Vector_impl_data._M_start !=
           local_78._M_impl.super__Vector_impl_data._M_finish) {
      node = (__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (local_78._M_impl.super__Vector_impl_data._M_finish + -1))->_vptr__Sp_counted_base;
      peVar1 = *(element_type **)
                &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 (local_78._M_impl.super__Vector_impl_data._M_finish + -1))->_M_use_count;
      peVar9 = node->_M_ptr;
      if (peVar1 == (element_type *)
                    (peVar9->children).
                    super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        lVar2 = *(long *)((long)(local_98->rule_map).map._M_elems +
                         (ulong)(((peVar9->type_).def)->default_map_id & 0xfffffff8));
        if (*(char *)(lVar2 + 0x418) == '\0') {
          local_b0._M_current =
               (peVar9->children).
               super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_a8 = 0;
          local_48 = p_Var11;
LAB_0015516e:
          if (local_b0._M_current !=
              (node->_M_ptr->children).
              super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            puVar10 = *(undefined8 **)
                       (lVar2 + 0x18 +
                       (ulong)((((((local_b0._M_current)->
                                  super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr)->type_).def)->default_map_id & 0xfffffff8));
            puVar3 = (undefined8 *)puVar10[1];
            local_80._M_current = local_b0._M_current;
            for (puVar10 = (undefined8 *)*puVar10; puVar10 != puVar3; puVar10 = puVar10 + 0x14) {
              match->index = 0;
              ((match->captures).
               super__Vector_base<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>,_std::allocator<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->first = false;
              local_b0._M_current = local_80._M_current;
              cVar4 = (**(code **)(*(long *)*puVar10 + 0x20))((long *)*puVar10,&local_b0,node,match)
              ;
              if (((cVar4 != '\0') &&
                  (bVar5 = std::
                           any_of<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>,trieste::range_contains_error(__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>)::_lambda(auto:1&)_1_>
                                     (local_80._M_current,local_b0._M_current), !bVar5)) &&
                 (pVar8 = replace(local_98,match,(Effect<Node> *)(puVar10 + 0x10),&local_80,
                                  &local_b0,(Node *)node), pVar8 != -1)) {
                local_a8 = local_a8 + pVar8;
                if ((local_98->direction_ & 4) == 0) {
                  local_b0._M_current =
                       (node->_M_ptr->children).
                       super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                }
                else {
                  local_b0._M_current = local_b0._M_current + pVar8;
                }
                goto LAB_0015516e;
              }
            }
            local_b0._M_current = local_80._M_current + 1;
            goto LAB_0015516e;
          }
          peVar9 = node->_M_ptr;
          p_Var11 = local_48;
        }
        else {
          local_a8 = 0;
        }
        iVar6 = CLI::std::
                _Rb_tree<trieste::Token,_std::pair<const_trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>_>,_std::_Select1st<std::pair<const_trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>_>_>_>
                ::find(&local_60->_M_t,&peVar9->type_);
        uVar7 = local_a8 + local_a0;
        local_a8 = uVar7;
        if (iVar6._M_node != p_Var11) {
          CLI::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_90,node);
          uVar7 = CLI::std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>::operator()
                            ((function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)> *)
                             &iVar6._M_node[1]._M_parent,(shared_ptr<trieste::NodeDef> *)&local_90);
          uVar7 = local_a8 + uVar7;
          CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_90._M_refcount);
        }
        local_78._M_impl.super__Vector_impl_data._M_finish =
             local_78._M_impl.super__Vector_impl_data._M_finish + -1;
        local_a0 = uVar7;
      }
      else {
        *(Token **)
         &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          (local_78._M_impl.super__Vector_impl_data._M_finish + -1))->_M_use_count = &peVar1->type_;
        peVar9 = (peVar1->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                 super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((((peVar9->type_).def)->fl & 0x40) == 0) {
          iVar6 = CLI::std::
                  _Rb_tree<trieste::Token,_std::pair<const_trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>_>,_std::_Select1st<std::pair<const_trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>_>_>_>
                  ::find(&local_38->_M_t,&peVar9->type_);
          if (iVar6._M_node != local_40) {
            CLI::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_90,
                       (__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)peVar1);
            uVar7 = CLI::std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>::
                    operator()((function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)> *)
                               &iVar6._M_node[1]._M_parent,(shared_ptr<trieste::NodeDef> *)&local_90
                              );
            local_a0 = local_a0 + uVar7;
            CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_90._M_refcount);
          }
          local_90._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (((peVar1->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                 super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->children).
               super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_90._M_ptr = peVar1;
          std::
          vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
          ::
          emplace_back<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>
                    ((vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
                      *)&local_78,
                     (pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
                      *)&local_90);
        }
      }
    }
    CLI::std::
    _Vector_base<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>
    ::~_Vector_base(&local_78);
    uVar7 = local_a0;
  }
  else {
    uVar7 = 0;
  }
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffb0);
  return uVar7;
}

Assistant:

size_t apply_special(Node root, Match& match)
    {
      size_t changes = 0;

      auto add = [&](Node& node) SNMALLOC_FAST_PATH_LAMBDA {
        // Don't examine Error or Lift nodes.
        if (node->type() & flag::internal)
          return false;

        if constexpr (Pre)
        {
          auto pre_f = pre_.find(node->type());
          if (pre_f != pre_.end())
            changes += pre_f->second(node);
        }
        if constexpr (Topdown)
          changes += match_children(node, match);

        return true;
      };

      auto remove = [&](Node& node) SNMALLOC_FAST_PATH_LAMBDA {
        if constexpr (!Topdown)
          changes += match_children(node, match);
        else
          snmalloc::UNUSED(node);
        if constexpr (Post)
        {
          auto post_f = post_.find(node->type());
          if (post_f != post_.end())
            changes += post_f->second(node);
        }
      };

      root->traverse(add, remove);

      return changes;
    }